

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# umutablecptrie.cpp
# Opt level: O0

void __thiscall
icu_63::anon_unknown_0::MutableCodePointTrie::MutableCodePointTrie
          (MutableCodePointTrie *this,MutableCodePointTrie *other,UErrorCode *errorCode)

{
  UBool UVar1;
  int iVar2;
  uint32_t *puVar3;
  int32_t iLimit;
  int32_t iCapacity;
  UErrorCode *errorCode_local;
  MutableCodePointTrie *other_local;
  MutableCodePointTrie *this_local;
  
  this->index = (uint32_t *)0x0;
  this->indexCapacity = 0;
  this->index3NullOffset = other->index3NullOffset;
  this->data = (uint32_t *)0x0;
  this->dataCapacity = 0;
  this->dataLength = 0;
  this->dataNullOffset = other->dataNullOffset;
  this->origInitialValue = other->origInitialValue;
  this->initialValue = other->initialValue;
  this->errorValue = other->errorValue;
  this->highStart = other->highStart;
  this->highValue = other->highValue;
  this->index16 = (uint16_t *)0x0;
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    iVar2 = 0x11000;
    if (this->highStart < 0x10001) {
      iVar2 = 0x1000;
    }
    puVar3 = (uint32_t *)uprv_malloc_63((long)(iVar2 << 2));
    this->index = puVar3;
    puVar3 = (uint32_t *)uprv_malloc_63((long)(other->dataCapacity << 2));
    this->data = puVar3;
    if ((this->index == (uint32_t *)0x0) || (this->data == (uint32_t *)0x0)) {
      *errorCode = U_MEMORY_ALLOCATION_ERROR;
    }
    else {
      this->indexCapacity = iVar2;
      this->dataCapacity = other->dataCapacity;
      iVar2 = this->highStart >> 4;
      memcpy(this->flags,other->flags,(long)iVar2);
      memcpy(this->index,other->index,(long)(iVar2 << 2));
      memcpy(this->data,other->data,(long)other->dataLength << 2);
      this->dataLength = other->dataLength;
    }
  }
  return;
}

Assistant:

MutableCodePointTrie::MutableCodePointTrie(const MutableCodePointTrie &other, UErrorCode &errorCode) :
        index3NullOffset(other.index3NullOffset),
        dataNullOffset(other.dataNullOffset),
        origInitialValue(other.origInitialValue), initialValue(other.initialValue),
        errorValue(other.errorValue),
        highStart(other.highStart), highValue(other.highValue)
#ifdef UCPTRIE_DEBUG
        , name("mutable clone")
#endif
        {
    if (U_FAILURE(errorCode)) { return; }
    int32_t iCapacity = highStart <= BMP_LIMIT ? BMP_I_LIMIT : I_LIMIT;
    index = (uint32_t *)uprv_malloc(iCapacity * 4);
    data = (uint32_t *)uprv_malloc(other.dataCapacity * 4);
    if (index == nullptr || data == nullptr) {
        errorCode = U_MEMORY_ALLOCATION_ERROR;
        return;
    }
    indexCapacity = iCapacity;
    dataCapacity = other.dataCapacity;

    int32_t iLimit = highStart >> UCPTRIE_SHIFT_3;
    uprv_memcpy(flags, other.flags, iLimit);
    uprv_memcpy(index, other.index, iLimit * 4);
    uprv_memcpy(data, other.data, (size_t)other.dataLength * 4);
    dataLength = other.dataLength;
    U_ASSERT(other.index16 == nullptr);
}